

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O2

void __thiscall FIX::FileLogFactory::~FileLogFactory(FileLogFactory *this)

{
  *(undefined **)this = &SocketAcceptor::typeinfo;
  SessionSettings::~SessionSettings((SessionSettings *)(this + 0x48));
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::__cxx11::string::~string((string *)(this + 8));
  return;
}

Assistant:

FileLogFactory(const SessionSettings &settings)
      : m_settings(settings),
        m_globalLog(0),
        m_globalLogCount(0) {}